

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

expr * printreg(disctx *ctx,ull *a,ull *m,reg *reg)

{
  expr *peVar1;
  long *in_RCX;
  long in_RDI;
  char *suf;
  int i;
  ull num;
  expr *expr;
  ulong in_stack_ffffffffffffffb0;
  etype type;
  disctx *in_stack_ffffffffffffffb8;
  char *pcVar2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  ulong uVar4;
  bitfield *in_stack_ffffffffffffffd0;
  expr *local_8;
  
  uVar4 = 0;
  if (*in_RCX != 0) {
    uVar4 = getbf(in_stack_ffffffffffffffd0,(ull *)0x0,
                  (ull *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8);
  }
  type = (etype)(in_stack_ffffffffffffffb0 >> 0x20);
  if (in_RCX[3] != 0) {
    iVar3 = 0;
    while (type = (etype)(in_stack_ffffffffffffffb0 >> 0x20),
          *(int *)(in_RCX[3] + (long)iVar3 * 0x18) != -1) {
      if (((*(int *)(in_RCX[3] + (long)iVar3 * 0x18 + 0x14) == 0) ||
          ((*(uint *)(in_RCX[3] + (long)iVar3 * 0x18 + 0x14) & *(uint *)(in_RDI + 0x38)) != 0)) &&
         (uVar4 == (long)*(int *)(in_RCX[3] + (long)iVar3 * 0x18))) {
        in_stack_ffffffffffffffb0 = (ulong)*(uint *)(in_RCX[3] + 0x10 + (long)iVar3 * 0x18);
        switch(in_stack_ffffffffffffffb0) {
        case 0:
          peVar1 = makeex(EXPR_NUM);
          peVar1->str = *(char **)(in_RCX[3] + (long)iVar3 * 0x18 + 8);
          peVar1->special = 1;
          return peVar1;
        case 1:
          return (expr *)0x0;
        case 2:
          peVar1 = makeex(EXPR_NUM);
          peVar1->num1 = 1;
          return peVar1;
        case 3:
          peVar1 = makeex(EXPR_NUM);
          return peVar1;
        }
      }
      iVar3 = iVar3 + 1;
    }
  }
  local_8 = makeex(type);
  pcVar2 = "";
  if (in_RCX[2] != 0) {
    pcVar2 = (char *)in_RCX[2];
  }
  if (*(int *)((long)in_RCX + 0x24) != 0) {
    if ((uVar4 & 1) == 0) {
      pcVar2 = "l";
    }
    else {
      pcVar2 = "h";
    }
    uVar4 = uVar4 >> 1;
  }
  local_8->special = (int)in_RCX[5];
  if ((int)in_RCX[4] != 0) {
    local_8->special = 2;
  }
  if (*in_RCX == 0) {
    pcVar2 = aprint("%s%s",in_RCX[1],pcVar2);
    local_8->str = pcVar2;
  }
  else {
    pcVar2 = aprint("%s%lld%s",in_RCX[1],uVar4,pcVar2);
    local_8->str = pcVar2;
  }
  return local_8;
}

Assistant:

static struct expr *printreg (struct disctx *ctx, ull *a, ull *m, const struct reg *reg) {
	struct expr *expr;
	ull num = 0;
	if (reg->bf)
		num = GETBF(reg->bf);
	if (reg->specials) {
		int i;
		for (i = 0; reg->specials[i].num != -1; i++) {
			if (reg->specials[i].vartype && !(reg->specials[i].vartype & ctx->vartype))
				continue;
			if (num == reg->specials[i].num) {
				switch (reg->specials[i].mode) {
					case SR_NAMED:
						expr = makeex(EXPR_REG);
						expr->str = reg->specials[i].name;
						expr->special = 1;
						return expr;
					case SR_ZERO:
						return 0;
					case SR_ONE:
						expr = makeex(EXPR_NUM);
						expr->num1 = 1;
						return expr;
					case SR_DISCARD:
						expr = makeex(EXPR_DISCARD);
						return expr;
				}
			}
		}
	}
	expr = makeex(EXPR_REG);
	const char *suf = "";
	if (reg->suffix)
		suf = reg->suffix;
	if (reg->hilo) {
		if (num & 1)
			suf = "h";
		else
			suf = "l";
		num >>= 1;
	}
	expr->special = reg->cool;
	if (reg->always_special)
		expr->special = 2;
	if (reg->bf)
		expr->str = aprint("%s%lld%s", reg->name, num, suf);
	else
		expr->str = aprint("%s%s", reg->name, suf);
	return expr;
}